

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

HierarchyInstantiationSyntax * __thiscall
slang::parsing::Parser::parseHierarchyInstantiation(Parser *this,AttrList attributes)

{
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  size_t __n;
  value_type_pointer pbVar23;
  ulong uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  bool bVar41;
  int iVar42;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar43;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *pHVar44;
  uint64_t hash;
  ulong extraout_RAX;
  uint uVar45;
  ulong uVar46;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  group_type_pointer pgVar47;
  ulong uVar48;
  ulong uVar49;
  ulong pos0;
  ulong uVar50;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *arrays_;
  TokenKind kind;
  long lVar51;
  undefined1 auVar52 [16];
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  Token TVar69;
  string_view name;
  Token semi;
  value_type *elements;
  Token type;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  string_view local_220;
  ulong local_210;
  uint64_t local_208;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_200;
  Token local_1f8;
  long local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  group_type_pointer local_1c0;
  value_type_pointer local_1b8;
  char *local_1b0;
  ParameterValueAssignmentSyntax *local_1a8;
  pointer local_1a0;
  Token local_198;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_188;
  undefined1 local_178 [16];
  size_t local_168;
  pointer local_160;
  size_t local_158;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  pointer local_128;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  uchar uStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  uchar uStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  uchar uStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  uchar uStack_109;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_1a0 = attributes._M_ptr;
  local_198 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1a8 = parseParameterValueAssignment(this);
  local_220 = Token::valueText(&local_198);
  if (((local_220._M_len != 0) && (local_198.kind == Identifier)) &&
     (((this->moduleDeclStack).
       super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       .len == 0 || (parseHierarchyInstantiation(), (extraout_RAX & 1) == 0)))) {
    arrays_ = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               *)&(this->meta).globalInstances;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_,
                      &local_220);
    uVar49 = hash >> ((byte)(this->meta).globalInstances.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_size_index & 0x3f);
    pgVar47 = (this->meta).globalInstances.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_;
    lVar2 = (hash & 0xff) * 4;
    uVar53 = (&UNK_0049b57c)[lVar2];
    uVar54 = (&UNK_0049b57d)[lVar2];
    uVar55 = (&UNK_0049b57e)[lVar2];
    uVar56 = (&UNK_0049b57f)[lVar2];
    local_1b8 = (this->meta).globalInstances.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.elements_;
    __n = local_220._M_len;
    local_1b0 = local_220._M_str;
    uVar46 = (ulong)((uint)hash & 7);
    uVar48 = (this->meta).globalInstances.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask;
    uVar50 = 0;
    pos0 = uVar49;
    uVar57 = uVar53;
    uVar58 = uVar54;
    uVar59 = uVar55;
    uVar60 = uVar56;
    uVar61 = uVar53;
    uVar62 = uVar54;
    uVar63 = uVar55;
    uVar64 = uVar56;
    uVar65 = uVar53;
    uVar66 = uVar54;
    uVar67 = uVar55;
    uVar68 = uVar56;
    do {
      pbVar23 = local_1b8;
      pgVar3 = pgVar47 + uVar49;
      auVar52[0] = -(pgVar3->m[0].n == uVar53);
      auVar52[1] = -(pgVar3->m[1].n == uVar54);
      auVar52[2] = -(pgVar3->m[2].n == uVar55);
      auVar52[3] = -(pgVar3->m[3].n == uVar56);
      auVar52[4] = -(pgVar3->m[4].n == uVar57);
      auVar52[5] = -(pgVar3->m[5].n == uVar58);
      auVar52[6] = -(pgVar3->m[6].n == uVar59);
      auVar52[7] = -(pgVar3->m[7].n == uVar60);
      auVar52[8] = -(pgVar3->m[8].n == uVar61);
      auVar52[9] = -(pgVar3->m[9].n == uVar62);
      auVar52[10] = -(pgVar3->m[10].n == uVar63);
      auVar52[0xb] = -(pgVar3->m[0xb].n == uVar64);
      auVar52[0xc] = -(pgVar3->m[0xc].n == uVar65);
      auVar52[0xd] = -(pgVar3->m[0xd].n == uVar66);
      auVar52[0xe] = -(pgVar3->m[0xe].n == uVar67);
      auVar52[0xf] = -(pgVar3->m[0xf].n == uVar68);
      lVar51 = uVar49 * 0x10;
      uVar24 = uVar49;
      uVar25 = uVar53;
      uVar26 = uVar54;
      uVar27 = uVar55;
      uVar28 = uVar56;
      uVar29 = uVar57;
      uVar30 = uVar58;
      uVar31 = uVar59;
      uVar32 = uVar60;
      uVar33 = uVar61;
      uVar34 = uVar62;
      uVar35 = uVar63;
      uVar36 = uVar64;
      uVar37 = uVar65;
      uVar38 = uVar66;
      uVar39 = uVar67;
      uVar40 = uVar68;
      lVar2 = local_1e8;
      uVar5 = local_1e0;
      uVar6 = local_1d8;
      uVar7 = local_118;
      uVar8 = uStack_117;
      uVar9 = uStack_116;
      uVar10 = uStack_115;
      uVar11 = uStack_114;
      uVar12 = uStack_113;
      uVar13 = uStack_112;
      uVar14 = uStack_111;
      uVar15 = uStack_110;
      uVar16 = uStack_10f;
      uVar17 = uStack_10e;
      uVar18 = uStack_10d;
      uVar19 = uStack_10c;
      uVar20 = uStack_10b;
      uVar21 = uStack_10a;
      uVar22 = uStack_109;
      for (uVar45 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe);
          uStack_109 = uVar40, uStack_10a = uVar39, uStack_10b = uVar38, uStack_10c = uVar37,
          uStack_10d = uVar36, uStack_10e = uVar35, uStack_10f = uVar34, uStack_110 = uVar33,
          uStack_111 = uVar32, uStack_112 = uVar31, uStack_113 = uVar30, uStack_114 = uVar29,
          uStack_115 = uVar28, uStack_116 = uVar27, uStack_117 = uVar26, local_118 = uVar25,
          local_1e0 = uVar50, local_1d8 = uVar24, local_1e8 = lVar51, uVar45 != 0;
          uVar45 = uVar45 - 1 & uVar45) {
        iVar42 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
          }
        }
        bVar41 = __n == *(size_t *)
                         ((long)&pbVar23[uVar49 * 0xf]._M_len + (ulong)(uint)(iVar42 << 4));
        lVar51 = (long)&pbVar23[uVar49 * 0xf]._M_len + (ulong)(uint)(iVar42 << 4);
        local_210 = pos0;
        local_208 = hash;
        local_200 = arrays_;
        local_1d0 = uVar48;
        local_1c8 = uVar46;
        local_1c0 = pgVar47;
        if (bVar41 && __n != 0) {
          iVar42 = bcmp(local_1b0,*(void **)(lVar51 + 8),__n);
          bVar41 = iVar42 == 0;
          uVar53 = local_118;
          uVar54 = uStack_117;
          uVar55 = uStack_116;
          uVar56 = uStack_115;
          uVar57 = uStack_114;
          uVar58 = uStack_113;
          uVar59 = uStack_112;
          uVar60 = uStack_111;
          uVar61 = uStack_110;
          uVar62 = uStack_10f;
          uVar63 = uStack_10e;
          uVar64 = uStack_10d;
          uVar65 = uStack_10c;
          uVar66 = uStack_10b;
          uVar67 = uStack_10a;
          uVar68 = uStack_109;
        }
        hash = local_208;
        pos0 = local_210;
        arrays_ = local_200;
        if (bVar41) goto LAB_003bf5c1;
        lVar51 = local_1e8;
        uVar46 = local_1c8;
        pgVar47 = local_1c0;
        uVar48 = local_1d0;
        uVar24 = local_1d8;
        uVar50 = local_1e0;
        uVar25 = local_118;
        uVar26 = uStack_117;
        uVar27 = uStack_116;
        uVar28 = uStack_115;
        uVar29 = uStack_114;
        uVar30 = uStack_113;
        uVar31 = uStack_112;
        uVar32 = uStack_111;
        uVar33 = uStack_110;
        uVar34 = uStack_10f;
        uVar35 = uStack_10e;
        uVar36 = uStack_10d;
        uVar37 = uStack_10c;
        uVar38 = uStack_10b;
        uVar39 = uStack_10a;
        uVar40 = uStack_109;
        lVar2 = local_1e8;
        uVar5 = local_1e0;
        uVar6 = local_1d8;
        uVar7 = local_118;
        uVar8 = uStack_117;
        uVar9 = uStack_116;
        uVar10 = uStack_115;
        uVar11 = uStack_114;
        uVar12 = uStack_113;
        uVar13 = uStack_112;
        uVar14 = uStack_111;
        uVar15 = uStack_110;
        uVar16 = uStack_10f;
        uVar17 = uStack_10e;
        uVar18 = uStack_10d;
        uVar19 = uStack_10c;
        uVar20 = uStack_10b;
        uVar21 = uStack_10a;
        uVar22 = uStack_109;
      }
      local_118 = uVar7;
      uStack_117 = uVar8;
      uStack_116 = uVar9;
      uStack_115 = uVar10;
      uStack_114 = uVar11;
      uStack_113 = uVar12;
      uStack_112 = uVar13;
      uStack_111 = uVar14;
      uStack_110 = uVar15;
      uStack_10f = uVar16;
      uStack_10e = uVar17;
      uStack_10d = uVar18;
      uStack_10c = uVar19;
      uStack_10b = uVar20;
      uStack_10a = uVar21;
      uStack_109 = uVar22;
      if ((((slot_type *)((long)pgVar47 + 0xf))[local_1e8].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar46]) == 0) break;
      uVar50 = local_1e0 + 1;
      uVar49 = local_1d8 + local_1e0 + 1 & uVar48;
      local_1e8 = lVar2;
      local_1e0 = uVar5;
      local_1d8 = uVar6;
    } while (uVar50 <= uVar48);
    lVar51 = 0;
    local_1e8 = lVar2;
    local_1e0 = uVar5;
    local_1d8 = uVar6;
LAB_003bf5c1:
    if (lVar51 == 0) {
      if ((this->meta).globalInstances.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.size <
          (this->meta).globalInstances.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                  ((locator *)local_108,arrays_,(arrays_type *)arrays_,pos0,hash,&local_220);
        psVar1 = &(this->meta).globalInstances.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                  ((locator *)local_108,arrays_,hash,&local_220);
      }
    }
  }
  Token::Token(&local_1f8);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  local_150 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar41 = slang::syntax::SyntaxFacts::isSemicolon(local_150._0_2_);
  if (bVar41) {
    bVar41 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar41) {
      location = Token::location((Token *)local_150);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
    local_1f8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar41 = slang::syntax::SyntaxFacts::isPossibleInstance(local_150._0_2_);
    if (!bVar41) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_150,Semicolon,&local_1f8,(DiagCode)0x400005);
      src = extraout_RDX_03;
      goto LAB_003bf2cf;
    }
    do {
      pHVar43 = parseHierarchicalInstance(this);
      local_188._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar43;
      local_178[0] = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_188._M_first);
      TVar69 = ParserBase::peek(&this->super_ParserBase);
      bVar41 = slang::syntax::SyntaxFacts::isSemicolon(TVar69.kind);
      iVar42 = 3;
      src = extraout_RDX;
      if (TVar69.kind == Comma && !bVar41) {
        local_188._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        auVar4[0xf] = 0;
        auVar4._0_15_ = local_178._1_15_;
        local_178 = auVar4 << 8;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_188._M_first);
        TVar69 = ParserBase::peek(&this->super_ParserBase);
        kind = TVar69.kind;
        bVar41 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar41) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if (((local_150._0_2_ != kind) || ((Info *)local_150._8_8_ != TVar69.info)) ||
             (bVar41 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                                 (&this->super_ParserBase,(DiagCode)0x400005,true),
             src = extraout_RDX_02, bVar41)) {
            iVar42 = 0;
            local_150 = (undefined1  [16])TVar69;
          }
        }
      }
    } while (iVar42 == 0);
    if (iVar42 != 3) goto LAB_003bf2cf;
    local_1f8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_1f8.info;
LAB_003bf2cf:
  TVar69 = local_198;
  local_188._8_4_ = 1;
  local_178 = (undefined1  [16])0x0;
  local_160 = local_1a0;
  local_188._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005e5c48;
  local_168 = attributes._M_extent._M_extent_value._M_extent_value;
  local_158 = attributes._M_extent._M_extent_value._M_extent_value;
  iVar42 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                     (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_128 = (pointer)CONCAT44(extraout_var,iVar42);
  local_150._8_4_ = 3;
  local_140 = (undefined1  [16])0x0;
  local_150._0_8_ = &PTR_getChild_005e61f0;
  pHVar44 = slang::syntax::SyntaxFactory::hierarchyInstantiation
                      (&this->factory,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_188._M_first,
                       TVar69,local_1a8,
                       (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)local_150,
                       local_1f8);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pHVar44;
}

Assistant:

HierarchyInstantiationSyntax& Parser::parseHierarchyInstantiation(AttrList attributes) {
    auto type = expect(TokenKind::Identifier);
    auto parameters = parseParameterValueAssignment();

    // If this is an instantiation of a global module/interface/program,
    // keep track of it in our instantiatedModules set.
    std::string_view name = type.valueText();
    if (!name.empty() && type.kind == TokenKind::Identifier) {
        bool found = false;
        for (auto& set : moduleDeclStack) {
            if (set.find(name) != set.end()) {
                found = true;
                break;
            }
        }
        if (!found)
            meta.globalInstances.emplace(name);
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.hierarchyInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}